

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FkDelete(sqlite3 *db,Table *pTab)

{
  FKey *pFVar1;
  char *local_40;
  char *z;
  void *p;
  FKey *pNext;
  FKey *pFKey;
  Table *pTab_local;
  sqlite3 *db_local;
  
  pNext = pTab->pFKey;
  while (pNext != (FKey *)0x0) {
    if ((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) {
      if (pNext->pPrevTo == (FKey *)0x0) {
        if (pNext->pNextTo == (FKey *)0x0) {
          local_40 = pNext->zTo;
        }
        else {
          local_40 = pNext->pNextTo->zTo;
        }
        sqlite3HashInsert(&pTab->pSchema->fkeyHash,local_40,pNext->pNextTo);
      }
      else {
        pNext->pPrevTo->pNextTo = pNext->pNextTo;
      }
      if (pNext->pNextTo != (FKey *)0x0) {
        pNext->pNextTo->pPrevTo = pNext->pPrevTo;
      }
    }
    fkTriggerDelete(db,pNext->apTrigger[0]);
    fkTriggerDelete(db,pNext->apTrigger[1]);
    pFVar1 = pNext->pNextFrom;
    sqlite3DbFree(db,pNext);
    pNext = pFVar1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkDelete(sqlite3 *db, Table *pTab){
  FKey *pFKey;                    /* Iterator variable */
  FKey *pNext;                    /* Copy of pFKey->pNextFrom */

  assert( db==0 || IsVirtual(pTab)
         || sqlite3SchemaMutexHeld(db, 0, pTab->pSchema) );
  for(pFKey=pTab->pFKey; pFKey; pFKey=pNext){

    /* Remove the FK from the fkeyHash hash table. */
    if( !db || db->pnBytesFreed==0 ){
      if( pFKey->pPrevTo ){
        pFKey->pPrevTo->pNextTo = pFKey->pNextTo;
      }else{
        void *p = (void *)pFKey->pNextTo;
        const char *z = (p ? pFKey->pNextTo->zTo : pFKey->zTo);
        sqlite3HashInsert(&pTab->pSchema->fkeyHash, z, p);
      }
      if( pFKey->pNextTo ){
        pFKey->pNextTo->pPrevTo = pFKey->pPrevTo;
      }
    }

    /* EV: R-30323-21917 Each foreign key constraint in SQLite is
    ** classified as either immediate or deferred.
    */
    assert( pFKey->isDeferred==0 || pFKey->isDeferred==1 );

    /* Delete any triggers created to implement actions for this FK. */
#ifndef SQLITE_OMIT_TRIGGER
    fkTriggerDelete(db, pFKey->apTrigger[0]);
    fkTriggerDelete(db, pFKey->apTrigger[1]);
#endif

    pNext = pFKey->pNextFrom;
    sqlite3DbFree(db, pFKey);
  }
}